

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O3

uint32 google::protobuf::compiler::cpp::anon_unknown_0::GenChunkMask
                 (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  *fields,vector<int,_std::allocator<int>_> *has_bit_indices)

{
  int iVar1;
  uint uVar2;
  FieldDescriptor *pFVar3;
  pointer ppFVar4;
  uint uVar5;
  LogMessage *pLVar6;
  long *plVar7;
  uint32 uVar8;
  vector<int,_std::allocator<int>_> *pvVar9;
  int iVar10;
  const_iterator __begin3;
  pointer ppFVar11;
  LogFinisher local_71;
  vector<int,_std::allocator<int>_> *local_70;
  LogMessage local_68;
  
  ppFVar11 = (fields->
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  local_70 = has_bit_indices;
  if (ppFVar11 ==
      (fields->
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
               ,0x1cc);
    pLVar6 = internal::LogMessage::operator<<(&local_68,"CHECK failed: !fields.empty(): ");
    internal::LogFinisher::operator=(&local_71,pLVar6);
    internal::LogMessage::~LogMessage(&local_68);
    ppFVar11 = (fields->
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
  }
  pFVar3 = *ppFVar11;
  if (pFVar3[0x42] == (FieldDescriptor)0x0) {
    plVar7 = (long *)(*(long *)(pFVar3 + 0x50) + 0x28);
  }
  else if (*(long *)(pFVar3 + 0x60) == 0) {
    plVar7 = (long *)(*(long *)(pFVar3 + 0x28) + 0x80);
  }
  else {
    plVar7 = (long *)(*(long *)(pFVar3 + 0x60) + 0x50);
  }
  iVar1 = (local_70->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[(int)((ulong)((long)pFVar3 - *plVar7) >> 3) * 0x286bca1b];
  iVar10 = iVar1 + 0x1f;
  if (-1 < iVar1) {
    iVar10 = iVar1;
  }
  ppFVar4 = (fields->
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (ppFVar11 == ppFVar4) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
               ,0x1d5);
    pLVar6 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (0) != (chunk_mask): ");
    internal::LogFinisher::operator=(&local_71,pLVar6);
    internal::LogMessage::~LogMessage(&local_68);
    uVar8 = 0;
  }
  else {
    uVar8 = 0;
    pvVar9 = local_70;
    do {
      pFVar3 = *ppFVar11;
      if (pFVar3[0x42] == (FieldDescriptor)0x0) {
        plVar7 = (long *)(*(long *)(pFVar3 + 0x50) + 0x28);
      }
      else if (*(long *)(pFVar3 + 0x60) == 0) {
        plVar7 = (long *)(*(long *)(pFVar3 + 0x28) + 0x80);
      }
      else {
        plVar7 = (long *)(*(long *)(pFVar3 + 0x60) + 0x50);
      }
      uVar2 = (pvVar9->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start
              [(int)((ulong)((long)pFVar3 - *plVar7) >> 3) * 0x286bca1b];
      uVar5 = uVar2 + 0x1f;
      if (-1 < (int)uVar2) {
        uVar5 = uVar2;
      }
      if (iVar10 >> 5 != (int)uVar5 >> 5) {
        internal::LogMessage::LogMessage
                  (&local_68,LOGLEVEL_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                   ,0x1d2);
        pLVar6 = internal::LogMessage::operator<<
                           (&local_68,"CHECK failed: (first_index_offset) == (index / 32): ");
        internal::LogFinisher::operator=(&local_71,pLVar6);
        internal::LogMessage::~LogMessage(&local_68);
        pvVar9 = local_70;
      }
      uVar8 = uVar8 | 1 << (uVar2 & 0x1f);
      ppFVar11 = ppFVar11 + 1;
    } while (ppFVar11 != ppFVar4);
  }
  return uVar8;
}

Assistant:

uint32 GenChunkMask(const std::vector<const FieldDescriptor*>& fields,
                    const std::vector<int>& has_bit_indices) {
  GOOGLE_CHECK(!fields.empty());
  int first_index_offset = has_bit_indices[fields.front()->index()] / 32;
  uint32 chunk_mask = 0;
  for (auto field : fields) {
    // "index" defines where in the _has_bits_ the field appears.
    int index = has_bit_indices[field->index()];
    GOOGLE_CHECK_EQ(first_index_offset, index / 32);
    chunk_mask |= static_cast<uint32>(1) << (index % 32);
  }
  GOOGLE_CHECK_NE(0, chunk_mask);
  return chunk_mask;
}